

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O0

SUNErrCode SUNMatScaleAddI_Sparse(sunrealtype c,SUNMatrix A)

{
  bool bVar1;
  long *in_RDI;
  double in_XMM0_Qa;
  sunindextype i_1;
  int found_1;
  sunindextype j_1;
  sunindextype new_nnz;
  sunindextype i;
  int found;
  sunindextype j;
  sunindextype newvals;
  sunrealtype *Ax;
  sunindextype *Ai;
  sunindextype *Ap;
  sunindextype M;
  sunindextype N;
  SUNContext_conflict sunctx_local_scope_;
  sunindextype in_stack_ffffffffffffff68;
  SUNMatrix A_00;
  long local_88;
  long local_80;
  long local_70;
  long local_60;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  
  if (*(int *)(*in_RDI + 0x28) == 0) {
    local_88 = *(long *)(*in_RDI + 8);
  }
  else {
    local_88 = *(long *)*in_RDI;
  }
  if (*(int *)(*in_RDI + 0x28) == 0) {
    A_00 = *(SUNMatrix *)*in_RDI;
  }
  else {
    A_00 = *(SUNMatrix *)(*in_RDI + 8);
  }
  local_30 = *(long *)(*in_RDI + 0x38);
  local_38 = *(long *)(*in_RDI + 0x30);
  local_40 = *(long *)(*in_RDI + 0x20);
  local_48 = 0;
  for (local_50 = 0; local_50 < local_88; local_50 = local_50 + 1) {
    bVar1 = false;
    for (local_60 = *(long *)(local_30 + local_50 * 8);
        local_60 < *(long *)(local_30 + 8 + local_50 * 8); local_60 = local_60 + 1) {
      if (*(long *)(local_38 + local_60 * 8) == local_50) {
        bVar1 = true;
        *(double *)(local_40 + local_60 * 8) =
             in_XMM0_Qa * *(double *)(local_40 + local_60 * 8) + 1.0;
      }
      else {
        *(double *)(local_40 + local_60 * 8) = in_XMM0_Qa * *(double *)(local_40 + local_60 * 8);
      }
    }
    if ((!bVar1) && (local_50 < (long)A_00)) {
      local_48 = local_48 + 1;
    }
  }
  if (*(long *)(*in_RDI + 0x10) < *(long *)(local_30 + local_88 * 8) + local_48) {
    SUNSparseMatrix_Reallocate(A_00,in_stack_ffffffffffffff68);
    local_30 = *(long *)(*in_RDI + 0x38);
    local_38 = *(long *)(*in_RDI + 0x30);
    local_40 = *(long *)(*in_RDI + 0x20);
  }
  while (local_70 = local_88 + -1, 0 < local_48) {
    bVar1 = false;
    local_80 = *(long *)(local_30 + 8 + local_70 * 8);
    while (local_80 = local_80 + -1, *(long *)(local_30 + local_70 * 8) <= local_80) {
      if (*(long *)(local_38 + local_80 * 8) == local_70) {
        bVar1 = true;
      }
      *(undefined8 *)(local_38 + (local_80 + local_48) * 8) =
           *(undefined8 *)(local_38 + local_80 * 8);
      *(undefined8 *)(local_40 + (local_80 + local_48) * 8) =
           *(undefined8 *)(local_40 + local_80 * 8);
    }
    *(long *)(local_30 + 8 + local_70 * 8) = local_48 + *(long *)(local_30 + 8 + local_70 * 8);
    local_88 = local_70;
    if ((!bVar1) && (local_70 < (long)A_00)) {
      local_48 = local_48 + -1;
      *(long *)(local_38 + (*(long *)(local_30 + local_70 * 8) + local_48) * 8) = local_70;
      *(undefined8 *)(local_40 + (*(long *)(local_30 + local_70 * 8) + local_48) * 8) =
           0x3ff0000000000000;
    }
  }
  return 0;
}

Assistant:

SUNErrCode SUNMatScaleAddI_Sparse(sunrealtype c, SUNMatrix A)
{
  SUNFunctionBegin(A->sunctx);
  const sunindextype N = SM_SPARSETYPE_S(A) == CSC_MAT ? SM_COLUMNS_S(A)
                                                       : SM_ROWS_S(A);
  const sunindextype M = SM_SPARSETYPE_S(A) == CSC_MAT ? SM_ROWS_S(A)
                                                       : SM_COLUMNS_S(A);

  sunindextype* Ap = SM_INDEXPTRS_S(A);
  SUNAssert(Ap, SUN_ERR_ARG_CORRUPT);
  sunindextype* Ai = SM_INDEXVALS_S(A);
  SUNAssert(Ai, SUN_ERR_ARG_CORRUPT);
  sunrealtype* Ax = SM_DATA_S(A);
  SUNAssert(Ax, SUN_ERR_ARG_CORRUPT);

  sunindextype newvals = 0;
  for (sunindextype j = 0; j < N; j++)
  {
    /* scan column (row if CSR) of A, searching for diagonal value */
    sunbooleantype found = SUNFALSE;
    for (sunindextype i = Ap[j]; i < Ap[j + 1]; i++)
    {
      if (Ai[i] == j)
      {
        found = SUNTRUE;
        Ax[i] = ONE + c * Ax[i];
      }
      else { Ax[i] *= c; }
    }
    /* If no diagonal element found and the current column (row) can actually
     * contain a diagonal element, increment the storage counter */
    if (!found && j < M) { newvals++; }
  }

  /* At this point, A has the correctly updated values except for any new
   * diagonal elements that need to be added (of which there are newvals). Now,
   * we allocate additional storage if needed */
  const sunindextype new_nnz = Ap[N] + newvals;
  if (new_nnz > SM_NNZ_S(A))
  {
    SUNCheckCall(SUNSparseMatrix_Reallocate(A, new_nnz));
    Ap = SM_INDEXPTRS_S(A);
    Ai = SM_INDEXVALS_S(A);
    Ax = SM_DATA_S(A);
  }

  for (sunindextype j = N - 1; newvals > 0; j--)
  {
    sunbooleantype found = SUNFALSE;
    for (sunindextype i = Ap[j + 1] - 1; i >= Ap[j]; i--)
    {
      if (Ai[i] == j) { found = SUNTRUE; }

      /* Shift elements to make room for diagonal elements */
      Ai[i + newvals] = Ai[i];
      Ax[i + newvals] = Ax[i];
    }

    Ap[j + 1] += newvals;
    if (!found && j < M)
    {
      /* This column (row) needs a diagonal element added */
      newvals--;
      Ai[Ap[j] + newvals] = j;
      Ax[Ap[j] + newvals] = ONE;
    }
  }

  return SUN_SUCCESS;
}